

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ReportLeaks(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  char *obj;
  undefined1 local_570 [8];
  Param param;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  bVar2 = Js::ConfigFlagsTable::IsEnabled(this->recyclerFlagsTable,LeakReportFlag);
  if (bVar2) {
    if (this->recyclerFlagsTable->ForceMemoryLeak == true) {
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&param.stats.numZeroedOutSmallBlocks + 3),
                 ExceptionType_DisableCheck);
      local_570 = (undefined1  [8])&ReportLeaks()::FakeMemory::typeinfo;
      param.dumpReferenceFunc = (_func_bool_char16_ptr_void_ptr_void_ptr *)0x0;
      param.dumpRootOnly = true;
      param.skipStack = true;
      param._10_6_ = 0xffffffffffff;
      param.stats.startCollectAllocBytes = (size_t)anon_var_dwarf_2794fc7;
      param.stats.startCollectNewPageCount._0_4_ = 0x21df;
      TrackAllocInfo(this,(TrackAllocData *)local_570);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_0071430a;
        *puVar4 = 0;
      }
      obj = AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,4);
      if (obj == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_0071430a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      RootAddRef(this,obj,(uint *)0x0);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&param.stats.numZeroedOutSmallBlocks + 3));
    }
    LeakReport::StartSection(L"Object Graph");
    LeakReport::StartRedirectOutput();
    memset((Param *)local_570,0,0x548);
    param.dumpReferenceFunc._0_2_ = CONCAT11(1,param.dumpReferenceFunc._0_1_);
    bVar2 = DumpObjectGraph(this,(Param *)local_570);
    if (!bVar2) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"ERROR: Out of memory generating leak report\n");
      param.stats.markData.rescanLargeByteCount = 0;
    }
    LeakReport::EndRedirectOutput();
    if (param.stats.markData.rescanLargeByteCount != 0) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"Recycler Leaked Object: %d bytes (%d objects)\n",
                        param.stats.markData.markCount,param.stats.markData.rescanLargeByteCount);
      if (this->recyclerFlagsTable->LeakStackTrace == true) {
        LeakReport::StartSection(L"Pinned object stack traces");
        LeakReport::StartRedirectOutput();
        PrintPinnedObjectStackTraces(this);
        LeakReport::EndRedirectOutput();
        LeakReport::EndSection();
      }
    }
    LeakReport::EndSection();
  }
  return;
}

Assistant:

void
Recycler::ReportLeaks()
{
    if (GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag))
    {
        if (GetRecyclerFlagsTable().ForceMemoryLeak)
        {
            AUTO_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            struct FakeMemory { Field(int) f; };
            FakeMemory * f = RecyclerNewStruct(this, FakeMemory);
            this->RootAddRef(f);
        }

        LeakReport::StartSection(_u("Object Graph"));
        LeakReport::StartRedirectOutput();

        RecyclerObjectGraphDumper::Param param = { 0 };
        param.skipStack = true;
        if (!this->DumpObjectGraph(&param))
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("ERROR: Out of memory generating leak report\n"));
            param.stats.markData.markCount = 0;
        }

        LeakReport::EndRedirectOutput();

        if (param.stats.markData.markCount != 0)
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("Recycler Leaked Object: %d bytes (%d objects)\n"),
                param.stats.markData.markBytes, param.stats.markData.markCount);

#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                LeakReport::StartSection(_u("Pinned object stack traces"));
                LeakReport::StartRedirectOutput();
                this->PrintPinnedObjectStackTraces();
                LeakReport::EndRedirectOutput();
                LeakReport::EndSection();
            }
#endif
        }
        LeakReport::EndSection();
    }
}